

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMarkers.cpp
# Opt level: O1

void __thiscall chrono::ChLinkMarkers::UpdateRelMarkerCoords(ChLinkMarkers *this)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  ChMarker *pCVar113;
  ChMarker *pCVar114;
  ChFrameMoving<double> *pCVar115;
  ChBodyFrame *pCVar116;
  undefined1 auVar117 [32];
  bool bVar118;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  double dVar125;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  double dVar146;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  ChQuaternion<double> *pCVar163;
  double dVar164;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  ChQuaternion<double> *pCVar178;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  ChQuaternion<double> *pCVar193;
  double dVar194;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  ChMatrix33<double> m2_Rel_A_dt;
  Quaternion temp2;
  Quaternion temp1;
  ChMatrix33<double> res;
  Quaternion qtemp1;
  ChMatrix33<double> m2_Rel_A_dtdt;
  ChMatrix33<double> local_2a0;
  ChQuaternion<double> local_258;
  ChQuaternion<double> *local_238;
  ChQuaternion<double> local_230;
  ChQuaternion<double> *local_210;
  ChQuaternion<double> *local_208;
  ChMatrix33<double> local_200;
  ChQuaternion<double> local_1b8;
  ChQuaternion<double> local_198;
  ChQuaternion<double> local_178;
  double local_150;
  double local_148;
  double local_140;
  ChQuaternion<double> local_138;
  ChQuaternion<double> local_118;
  ChMatrix33<double> local_f8;
  ChQuaternion<double> local_b0;
  ChQuaternion<double> local_90;
  ChQuaternion<double> local_70;
  ChQuaternion<double> local_50;
  
  pCVar113 = this->marker1;
  pCVar114 = this->marker2;
  dVar125 = (pCVar113->abs_frame).super_ChFrame<double>.coord.pos.m_data[2];
  dVar164 = (pCVar114->abs_frame).super_ChFrame<double>.coord.pos.m_data[2];
  dVar146 = (pCVar113->abs_frame).super_ChFrame<double>.coord.pos.m_data[1];
  dVar194 = (pCVar114->abs_frame).super_ChFrame<double>.coord.pos.m_data[1];
  (this->PQw).m_data[0] =
       (pCVar113->abs_frame).super_ChFrame<double>.coord.pos.m_data[0] -
       (pCVar114->abs_frame).super_ChFrame<double>.coord.pos.m_data[0];
  (this->PQw).m_data[1] = dVar146 - dVar194;
  (this->PQw).m_data[2] = dVar125 - dVar164;
  dVar125 = (pCVar113->abs_frame).coord_dt.pos.m_data[2];
  dVar164 = (pCVar114->abs_frame).coord_dt.pos.m_data[2];
  dVar146 = (pCVar113->abs_frame).coord_dt.pos.m_data[1];
  dVar194 = (pCVar114->abs_frame).coord_dt.pos.m_data[1];
  (this->PQw_dt).m_data[0] =
       (pCVar113->abs_frame).coord_dt.pos.m_data[0] - (pCVar114->abs_frame).coord_dt.pos.m_data[0];
  (this->PQw_dt).m_data[1] = dVar146 - dVar194;
  (this->PQw_dt).m_data[2] = dVar125 - dVar164;
  dVar125 = (pCVar113->abs_frame).coord_dtdt.pos.m_data[2];
  dVar164 = (pCVar114->abs_frame).coord_dtdt.pos.m_data[2];
  dVar146 = (pCVar113->abs_frame).coord_dtdt.pos.m_data[1];
  dVar194 = (pCVar114->abs_frame).coord_dtdt.pos.m_data[1];
  (this->PQw_dtdt).m_data[0] =
       (pCVar113->abs_frame).coord_dtdt.pos.m_data[0] -
       (pCVar114->abs_frame).coord_dtdt.pos.m_data[0];
  (this->PQw_dtdt).m_data[1] = dVar146 - dVar194;
  (this->PQw_dtdt).m_data[2] = dVar125 - dVar164;
  auVar126._8_8_ = 0;
  auVar126._0_8_ = (this->PQw).m_data[0];
  dVar125 = (this->PQw).m_data[1];
  auVar123._8_8_ = 0;
  auVar123._0_8_ = dVar125 * dVar125;
  auVar126 = vfmadd231sd_fma(auVar123,auVar126,auVar126);
  auVar121._8_8_ = 0;
  auVar121._0_8_ = (this->PQw).m_data[2];
  auVar126 = vfmadd213sd_fma(auVar121,auVar121,auVar126);
  if (auVar126._0_8_ < 0.0) {
    dVar125 = sqrt(auVar126._0_8_);
  }
  else {
    auVar126 = vsqrtsd_avx(auVar126,auVar126);
    dVar125 = auVar126._0_8_;
  }
  this->dist = dVar125;
  pCVar163 = (ChQuaternion<double> *)(this->PQw).m_data[0];
  auVar165._8_8_ = 0;
  auVar165._0_8_ = pCVar163;
  pCVar178 = (ChQuaternion<double> *)(this->PQw).m_data[1];
  pCVar193 = (ChQuaternion<double> *)(this->PQw).m_data[2];
  auVar195._8_8_ = 0;
  auVar195._0_8_ = pCVar193;
  auVar122._8_8_ = 0;
  auVar122._0_8_ = (double)pCVar178 * (double)pCVar178;
  auVar126 = vfmadd231sd_fma(auVar122,auVar165,auVar165);
  auVar126 = vfmadd231sd_fma(auVar126,auVar195,auVar195);
  if (auVar126._0_8_ < 0.0) {
    local_238 = pCVar163;
    local_210 = pCVar193;
    local_208 = pCVar178;
    dVar125 = sqrt(auVar126._0_8_);
    pCVar163 = local_238;
    pCVar178 = local_208;
    pCVar193 = local_210;
  }
  else {
    auVar126 = vsqrtsd_avx(auVar126,auVar126);
    dVar125 = auVar126._0_8_;
  }
  bVar118 = 2.2250738585072014e-308 <= dVar125;
  dVar125 = 1.0 / dVar125;
  auVar119._0_8_ =
       (ulong)bVar118 * (long)((double)pCVar163 * dVar125) + (ulong)!bVar118 * 0x3ff0000000000000;
  auVar119._8_8_ = 0;
  auVar120._8_8_ = 0;
  auVar120._0_8_ = (ulong)bVar118 * (long)((double)pCVar193 * dVar125);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (this->PQw_dt).m_data[0];
  auVar166._8_8_ = 0;
  auVar166._0_8_ =
       (double)((ulong)bVar118 * (long)((double)pCVar178 * dVar125)) * (this->PQw_dt).m_data[1];
  auVar126 = vfmadd231sd_fma(auVar166,auVar119,auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (this->PQw_dt).m_data[2];
  auVar126 = vfmadd231sd_fma(auVar126,auVar120,auVar3);
  this->dist_dt = auVar126._0_8_;
  local_178.m_data[0] = 0.0;
  local_178.m_data[1] = 0.0;
  local_178.m_data[2] = 0.0;
  local_178.m_data[3] = 0.0;
  pCVar113 = this->marker1;
  local_230.m_data[0] = (pCVar113->super_ChFrameMoving<double>).coord_dt.rot.m_data[0];
  local_230.m_data[1] = (pCVar113->super_ChFrameMoving<double>).coord_dt.rot.m_data[1];
  local_230.m_data[2] = (pCVar113->super_ChFrameMoving<double>).coord_dt.rot.m_data[2];
  local_230.m_data[3] = (pCVar113->super_ChFrameMoving<double>).coord_dt.rot.m_data[3];
  pCVar113 = this->marker2;
  local_258.m_data[0] = (pCVar113->super_ChFrameMoving<double>).coord_dt.rot.m_data[0];
  local_258.m_data[1] = (pCVar113->super_ChFrameMoving<double>).coord_dt.rot.m_data[1];
  local_258.m_data[2] = (pCVar113->super_ChFrameMoving<double>).coord_dt.rot.m_data[2];
  local_258.m_data[3] = (pCVar113->super_ChFrameMoving<double>).coord_dt.rot.m_data[3];
  bVar118 = Qnotnull(&local_230);
  if ((bVar118) || (bVar118 = Qnotnull(&local_258), bVar118)) {
    Qconjugate(&(this->marker2->super_ChFrameMoving<double>).coord_dt.rot);
    Qconjugate(&(this->marker2->Body->super_ChBodyFrame).super_ChFrameMoving<double>.
                super_ChFrame<double>.coord.rot);
    Qcross(&(this->marker1->Body->super_ChBodyFrame).super_ChFrameMoving<double>.
            super_ChFrame<double>.coord.rot,
           &(this->marker1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
    Qcross(&local_1b8,&local_118);
    Qcross((ChQuaternion<double> *)&local_200,&local_198);
    Qconjugate(&(this->marker2->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
    Qconjugate(&(this->marker2->Body->super_ChBodyFrame).super_ChFrameMoving<double>.
                super_ChFrame<double>.coord.rot);
    Qcross(&(this->marker1->Body->super_ChBodyFrame).super_ChFrameMoving<double>.
            super_ChFrame<double>.coord.rot,
           &(this->marker1->super_ChFrameMoving<double>).coord_dt.rot);
    Qcross(&local_90,&local_b0);
    Qcross(&local_50,&local_70);
    Qadd((ChQuaternion<double> *)&local_f8,&local_138);
    if (&local_2a0 != (ChMatrix33<double> *)&this->q_AD) {
      (this->q_AD).m_data[0] =
           local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      (this->q_AD).m_data[1] =
           local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      (this->q_AD).m_data[2] =
           local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      dVar125 = local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [3];
      goto LAB_00589463;
    }
  }
  else if (this != (ChLinkMarkers *)(sBulletDNAstr64 + 0x3438)) {
    (this->q_AD).m_data[0] = QNULL;
    (this->q_AD).m_data[1] = DAT_00b90958;
    (this->q_AD).m_data[2] = DAT_00b90960;
    dVar125 = DAT_00b90968;
LAB_00589463:
    (this->q_AD).m_data[3] = dVar125;
  }
  Qconjugate(&(this->marker2->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  Qconjugate(&(this->marker2->Body->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot);
  Qcross(&(this->marker1->Body->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>
          .coord.rot,&(this->marker1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  Qcross(&local_1b8,&local_118);
  Qcross((ChQuaternion<double> *)&local_200,&local_198);
  Qconjugate(&(this->marker2->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  Qconjugate(&(this->marker2->Body->super_ChBodyFrame).super_ChFrameMoving<double>.
              super_ChFrame<double>.coord.rot);
  Qcross(&(this->marker1->Body->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot,
         &(this->marker1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  Qcross(&local_90,&local_b0);
  Qcross(&local_50,&local_70);
  Qadd((ChQuaternion<double> *)&local_f8,&local_138);
  local_208 = &this->q_BC;
  if (&local_2a0 != (ChMatrix33<double> *)local_208) {
    (this->q_BC).m_data[0] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    (this->q_BC).m_data[1] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    (this->q_BC).m_data[2] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    (this->q_BC).m_data[3] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  }
  pCVar113 = this->marker2;
  if (&(pCVar113->super_ChFrameMoving<double>).coord_dtdt.rot != &local_258) {
    local_258.m_data[0] = (pCVar113->super_ChFrameMoving<double>).coord_dtdt.rot.m_data[0];
    local_258.m_data[1] = (pCVar113->super_ChFrameMoving<double>).coord_dtdt.rot.m_data[1];
    local_258.m_data[2] = (pCVar113->super_ChFrameMoving<double>).coord_dtdt.rot.m_data[2];
    local_258.m_data[3] = (pCVar113->super_ChFrameMoving<double>).coord_dtdt.rot.m_data[3];
  }
  bVar118 = Qnotnull(&local_258);
  if (bVar118) {
    Qconjugate(&(this->marker2->super_ChFrameMoving<double>).coord_dtdt.rot);
    Qconjugate(&(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
                coord.rot);
    Qcross(&(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.coord.
            rot,&(this->marker1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
    Qcross(&local_198,&local_1b8);
    Qcross((ChQuaternion<double> *)&local_f8,(ChQuaternion<double> *)&local_200);
    if (&local_2a0 == (ChMatrix33<double> *)&this->q_8) goto LAB_0058975a;
    (this->q_8).m_data[0] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    (this->q_8).m_data[1] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    (this->q_8).m_data[2] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    dVar125 = local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3]
    ;
  }
  else {
    if (this == (ChLinkMarkers *)(sBulletDNAstr64 + 0x33f8)) goto LAB_0058975a;
    (this->q_8).m_data[0] = QNULL;
    (this->q_8).m_data[1] = DAT_00b90958;
    (this->q_8).m_data[2] = DAT_00b90960;
    dVar125 = DAT_00b90968;
  }
  (this->q_8).m_data[3] = dVar125;
LAB_0058975a:
  pCVar113 = this->marker1;
  if (&(pCVar113->super_ChFrameMoving<double>).coord_dtdt.rot != &local_230) {
    local_230.m_data[0] = (pCVar113->super_ChFrameMoving<double>).coord_dtdt.rot.m_data[0];
    local_230.m_data[1] = (pCVar113->super_ChFrameMoving<double>).coord_dtdt.rot.m_data[1];
    local_230.m_data[2] = (pCVar113->super_ChFrameMoving<double>).coord_dtdt.rot.m_data[2];
    local_230.m_data[3] = (pCVar113->super_ChFrameMoving<double>).coord_dtdt.rot.m_data[3];
  }
  bVar118 = Qnotnull(&local_230);
  if (bVar118) {
    Qconjugate(&(this->marker2->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
    Qconjugate(&(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
                coord.rot);
    Qcross(&(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.coord.
            rot,&(this->marker1->super_ChFrameMoving<double>).coord_dtdt.rot);
    Qcross(&local_198,&local_1b8);
    Qcross((ChQuaternion<double> *)&local_f8,(ChQuaternion<double> *)&local_200);
    local_178.m_data[0] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    local_178.m_data[1] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    local_178.m_data[2] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    local_178.m_data[3] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    Qadd(&this->q_8,&local_178);
    if (&local_2a0 != (ChMatrix33<double> *)&this->q_8) {
      (this->q_8).m_data[0] =
           local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      (this->q_8).m_data[1] =
           local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      (this->q_8).m_data[2] =
           local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      (this->q_8).m_data[3] =
           local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    }
  }
  pCVar113 = this->marker2;
  if (&(pCVar113->super_ChFrameMoving<double>).coord_dt.rot != &local_258) {
    local_258.m_data[0] = (pCVar113->super_ChFrameMoving<double>).coord_dt.rot.m_data[0];
    local_258.m_data[1] = (pCVar113->super_ChFrameMoving<double>).coord_dt.rot.m_data[1];
    local_258.m_data[2] = (pCVar113->super_ChFrameMoving<double>).coord_dt.rot.m_data[2];
    local_258.m_data[3] = (pCVar113->super_ChFrameMoving<double>).coord_dt.rot.m_data[3];
  }
  bVar118 = Qnotnull(&local_258);
  if (bVar118) {
    Qconjugate(&(this->marker2->super_ChFrameMoving<double>).coord_dt.rot);
    Qconjugate(&(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).coord_dt.rot);
    Qcross(&(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.coord.
            rot,&(this->marker1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
    Qcross(&local_198,&local_1b8);
    Qcross((ChQuaternion<double> *)&local_f8,(ChQuaternion<double> *)&local_200);
    local_178.m_data[0] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    local_178.m_data[1] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    local_178.m_data[2] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    local_178.m_data[3] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    Qscale((ChQuaternion<double> *)&local_2a0,&local_178,2.0);
    local_178.m_data[0] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    local_178.m_data[1] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    local_178.m_data[2] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    local_178.m_data[3] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    Qadd(&this->q_8,&local_178);
    if (&local_2a0 != (ChMatrix33<double> *)&this->q_8) {
      (this->q_8).m_data[0] =
           local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      (this->q_8).m_data[1] =
           local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      (this->q_8).m_data[2] =
           local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      (this->q_8).m_data[3] =
           local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    }
  }
  pCVar113 = this->marker2;
  if (&(pCVar113->super_ChFrameMoving<double>).coord_dt.rot != &local_258) {
    local_258.m_data[0] = (pCVar113->super_ChFrameMoving<double>).coord_dt.rot.m_data[0];
    local_258.m_data[1] = (pCVar113->super_ChFrameMoving<double>).coord_dt.rot.m_data[1];
    local_258.m_data[2] = (pCVar113->super_ChFrameMoving<double>).coord_dt.rot.m_data[2];
    local_258.m_data[3] = (pCVar113->super_ChFrameMoving<double>).coord_dt.rot.m_data[3];
  }
  bVar118 = Qnotnull(&local_258);
  if (bVar118) {
    Qconjugate(&(this->marker2->super_ChFrameMoving<double>).coord_dt.rot);
    Qconjugate(&(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
                coord.rot);
    Qcross(&(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).coord_dt.rot,
           &(this->marker1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
    Qcross(&local_198,&local_1b8);
    Qcross((ChQuaternion<double> *)&local_f8,(ChQuaternion<double> *)&local_200);
    local_178.m_data[0] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    local_178.m_data[1] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    local_178.m_data[2] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    local_178.m_data[3] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    Qscale((ChQuaternion<double> *)&local_2a0,&local_178,2.0);
    local_178.m_data[0] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    local_178.m_data[1] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    local_178.m_data[2] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    local_178.m_data[3] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    Qadd(&this->q_8,&local_178);
    if (&local_2a0 != (ChMatrix33<double> *)&this->q_8) {
      (this->q_8).m_data[0] =
           local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      (this->q_8).m_data[1] =
           local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      (this->q_8).m_data[2] =
           local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      (this->q_8).m_data[3] =
           local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    }
  }
  pCVar113 = this->marker1;
  if (&(pCVar113->super_ChFrameMoving<double>).coord_dt.rot != &local_230) {
    local_230.m_data[0] = (pCVar113->super_ChFrameMoving<double>).coord_dt.rot.m_data[0];
    local_230.m_data[1] = (pCVar113->super_ChFrameMoving<double>).coord_dt.rot.m_data[1];
    local_230.m_data[2] = (pCVar113->super_ChFrameMoving<double>).coord_dt.rot.m_data[2];
    local_230.m_data[3] = (pCVar113->super_ChFrameMoving<double>).coord_dt.rot.m_data[3];
  }
  pCVar113 = this->marker2;
  if (&(pCVar113->super_ChFrameMoving<double>).coord_dt.rot != &local_258) {
    local_258.m_data[0] = (pCVar113->super_ChFrameMoving<double>).coord_dt.rot.m_data[0];
    local_258.m_data[1] = (pCVar113->super_ChFrameMoving<double>).coord_dt.rot.m_data[1];
    local_258.m_data[2] = (pCVar113->super_ChFrameMoving<double>).coord_dt.rot.m_data[2];
    local_258.m_data[3] = (pCVar113->super_ChFrameMoving<double>).coord_dt.rot.m_data[3];
  }
  bVar118 = Qnotnull(&local_258);
  if ((bVar118) && (bVar118 = Qnotnull(&local_230), bVar118)) {
    Qconjugate(&(this->marker2->super_ChFrameMoving<double>).coord_dt.rot);
    Qconjugate(&(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
                coord.rot);
    Qcross(&(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.coord.
            rot,&(this->marker1->super_ChFrameMoving<double>).coord_dt.rot);
    Qcross(&local_198,&local_1b8);
    Qcross((ChQuaternion<double> *)&local_f8,(ChQuaternion<double> *)&local_200);
    local_178.m_data[0] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    local_178.m_data[1] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    local_178.m_data[2] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    local_178.m_data[3] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    Qscale((ChQuaternion<double> *)&local_2a0,&local_178,2.0);
    local_178.m_data[0] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    local_178.m_data[1] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    local_178.m_data[2] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    local_178.m_data[3] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    Qadd(&this->q_8,&local_178);
    if (&local_2a0 != (ChMatrix33<double> *)&this->q_8) {
      (this->q_8).m_data[0] =
           local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      (this->q_8).m_data[1] =
           local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      (this->q_8).m_data[2] =
           local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      (this->q_8).m_data[3] =
           local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    }
  }
  Qconjugate(&(this->marker2->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  Qconjugate(&(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).coord_dt.rot);
  Qcross(&(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).coord_dt.rot,
         &(this->marker1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  Qcross(&local_198,&local_1b8);
  Qcross((ChQuaternion<double> *)&local_f8,(ChQuaternion<double> *)&local_200);
  local_178.m_data[0] =
       local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_178.m_data[1] =
       local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_178.m_data[2] =
       local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  local_178.m_data[3] =
       local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  Qscale((ChQuaternion<double> *)&local_2a0,&local_178,2.0);
  local_178.m_data[0] =
       local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_178.m_data[1] =
       local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_178.m_data[2] =
       local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  local_178.m_data[3] =
       local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  pCVar163 = &this->q_8;
  Qadd(pCVar163,&local_178);
  if (&local_2a0 != (ChMatrix33<double> *)pCVar163) {
    (this->q_8).m_data[0] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    (this->q_8).m_data[1] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    (this->q_8).m_data[2] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    (this->q_8).m_data[3] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  }
  pCVar113 = this->marker1;
  if (&(pCVar113->super_ChFrameMoving<double>).coord_dt.rot != &local_230) {
    local_230.m_data[0] = (pCVar113->super_ChFrameMoving<double>).coord_dt.rot.m_data[0];
    local_230.m_data[1] = (pCVar113->super_ChFrameMoving<double>).coord_dt.rot.m_data[1];
    local_230.m_data[2] = (pCVar113->super_ChFrameMoving<double>).coord_dt.rot.m_data[2];
    local_230.m_data[3] = (pCVar113->super_ChFrameMoving<double>).coord_dt.rot.m_data[3];
  }
  local_238 = pCVar163;
  bVar118 = Qnotnull(&local_230);
  if (bVar118) {
    Qconjugate(&(this->marker2->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
    Qconjugate(&(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).coord_dt.rot);
    Qcross(&(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.coord.
            rot,&(this->marker1->super_ChFrameMoving<double>).coord_dt.rot);
    Qcross(&local_198,&local_1b8);
    Qcross((ChQuaternion<double> *)&local_f8,(ChQuaternion<double> *)&local_200);
    local_178.m_data[0] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    local_178.m_data[1] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    local_178.m_data[2] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    local_178.m_data[3] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    Qscale((ChQuaternion<double> *)&local_2a0,&local_178,2.0);
    pCVar163 = local_238;
    local_178.m_data[0] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    local_178.m_data[1] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    local_178.m_data[2] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    local_178.m_data[3] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    Qadd(local_238,&local_178);
    if (&local_2a0 != (ChMatrix33<double> *)pCVar163) {
      (this->q_8).m_data[0] =
           local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      (this->q_8).m_data[1] =
           local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      (this->q_8).m_data[2] =
           local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      (this->q_8).m_data[3] =
           local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    }
  }
  pCVar113 = this->marker1;
  if (&(pCVar113->super_ChFrameMoving<double>).coord_dt.rot != &local_230) {
    local_230.m_data[0] = (pCVar113->super_ChFrameMoving<double>).coord_dt.rot.m_data[0];
    local_230.m_data[1] = (pCVar113->super_ChFrameMoving<double>).coord_dt.rot.m_data[1];
    local_230.m_data[2] = (pCVar113->super_ChFrameMoving<double>).coord_dt.rot.m_data[2];
    local_230.m_data[3] = (pCVar113->super_ChFrameMoving<double>).coord_dt.rot.m_data[3];
  }
  bVar118 = Qnotnull(&local_230);
  if (bVar118) {
    Qconjugate(&(this->marker2->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
    Qconjugate(&(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
                coord.rot);
    Qcross(&(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).coord_dt.rot,
           &(this->marker1->super_ChFrameMoving<double>).coord_dt.rot);
    Qcross(&local_198,&local_1b8);
    Qcross((ChQuaternion<double> *)&local_f8,(ChQuaternion<double> *)&local_200);
    local_178.m_data[0] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    local_178.m_data[1] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    local_178.m_data[2] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    local_178.m_data[3] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    Qscale((ChQuaternion<double> *)&local_2a0,&local_178,2.0);
    pCVar163 = local_238;
    local_178.m_data[0] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    local_178.m_data[1] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    local_178.m_data[2] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    local_178.m_data[3] =
         local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    Qadd(local_238,&local_178);
    if (&local_2a0 != (ChMatrix33<double> *)pCVar163) {
      (this->q_8).m_data[0] =
           local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      (this->q_8).m_data[1] =
           local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      (this->q_8).m_data[2] =
           local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      (this->q_8).m_data[3] =
           local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    }
  }
  ChFrameMoving<double>::Compute_Adt(&this->marker2->super_ChFrameMoving<double>,&local_2a0);
  ChFrameMoving<double>::Compute_Adtdt(&this->marker2->super_ChFrameMoving<double>,&local_f8);
  ChFrameMoving<double>::Compute_Adt
            (&((this->super_ChLink).Body2)->super_ChFrameMoving<double>,&local_200);
  auVar127._8_8_ = 0;
  auVar127._0_8_ = (this->PQw).m_data[0];
  dVar125 = (this->PQw).m_data[1];
  auVar167._8_8_ = 0;
  auVar167._0_8_ = (this->PQw).m_data[2];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
  auVar179._8_8_ = 0;
  auVar179._0_8_ =
       dVar125 * local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
  auVar126 = vfmadd231sd_fma(auVar179,auVar127,auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
  auVar126 = vfmadd231sd_fma(auVar126,auVar167,auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar196._8_8_ = 0;
  auVar196._0_8_ =
       dVar125 * local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
  auVar121 = vfmadd231sd_fma(auVar196,auVar127,auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
  auVar121 = vfmadd231sd_fma(auVar121,auVar167,auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
  auVar147._8_8_ = 0;
  auVar147._0_8_ =
       dVar125 * local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
  auVar123 = vfmadd231sd_fma(auVar147,auVar127,auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7];
  auVar123 = vfmadd231sd_fma(auVar123,auVar167,auVar9);
  auVar128._8_8_ = 0;
  auVar128._0_8_ =
       local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar209._8_8_ = 0;
  auVar209._0_8_ =
       local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar219._8_8_ = 0;
  auVar219._0_8_ =
       local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar230._8_8_ = 0;
  auVar230._0_8_ =
       local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar235._8_8_ = 0;
  auVar235._0_8_ =
       local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar238._8_8_ = 0;
  auVar238._0_8_ =
       local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  dVar125 = auVar123._0_8_;
  auVar239._8_8_ = 0;
  auVar239._0_8_ =
       local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       dVar125;
  auVar123 = vfmadd231sd_fma(auVar239,auVar235,auVar121);
  auVar123 = vfmadd231sd_fma(auVar123,auVar238,auVar126);
  dVar164 = auVar123._0_8_ + auVar123._0_8_;
  auVar240._8_8_ = 0;
  auVar240._0_8_ =
       dVar125 * local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
  auVar123 = vfmadd231sd_fma(auVar240,auVar219,auVar121);
  auVar123 = vfmadd231sd_fma(auVar123,auVar230,auVar126);
  dVar146 = auVar123._0_8_ + auVar123._0_8_;
  auVar148._8_8_ = 0;
  auVar148._0_8_ =
       dVar125 * local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
  auVar121 = vfmadd231sd_fma(auVar148,auVar209,auVar121);
  auVar126 = vfmadd231sd_fma(auVar121,auVar128,auVar126);
  dVar194 = auVar126._0_8_ + auVar126._0_8_;
  (this->q_4).m_data[0] = dVar194;
  (this->q_4).m_data[1] = dVar146;
  (this->q_4).m_data[2] = dVar164;
  pCVar115 = &((this->super_ChLink).Body2)->super_ChFrameMoving<double>;
  auVar180._8_8_ = 0;
  auVar180._0_8_ = (this->PQw_dt).m_data[0];
  dVar125 = (this->PQw_dt).m_data[1];
  auVar197._8_8_ = 0;
  auVar197._0_8_ = dVar125;
  auVar241._8_8_ = 0;
  auVar241._0_8_ = (this->PQw_dt).m_data[2];
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       *(double *)
        ((long)(pCVar115->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x10);
  auVar242._8_8_ = 0;
  auVar242._0_8_ =
       dVar125 * *(double *)
                  ((long)(pCVar115->super_ChFrame<double>).Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + 0x28);
  auVar126 = vfmadd231sd_fma(auVar242,auVar180,auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       *(double *)
        ((long)(pCVar115->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x40);
  auVar126 = vfmadd231sd_fma(auVar126,auVar241,auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       *(double *)
        ((long)(pCVar115->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x18);
  auVar121 = vmulsd_avx512f(auVar197,auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       (pCVar115->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar121 = vfmadd231sd_avx512f(auVar121,auVar180,auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       *(double *)
        ((long)(pCVar115->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x30);
  auVar122 = vfmadd231sd_avx512f(auVar121,auVar241,auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       *(double *)
        ((long)(pCVar115->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        8);
  auVar198._8_8_ = 0;
  auVar198._0_8_ =
       dVar125 * *(double *)
                  ((long)(pCVar115->super_ChFrame<double>).Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + 0x20);
  auVar121 = vfmadd231sd_fma(auVar198,auVar180,auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       *(double *)
        ((long)(pCVar115->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x38);
  auVar121 = vfmadd231sd_fma(auVar121,auVar241,auVar16);
  dVar125 = auVar121._0_8_;
  auVar181._8_8_ = 0;
  auVar181._0_8_ =
       local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       dVar125;
  auVar121 = vfmadd231sd_avx512f(auVar181,auVar122,auVar235);
  auVar121 = vfmadd231sd_fma(auVar121,auVar126,auVar238);
  auVar225._8_8_ = 0;
  auVar225._0_8_ =
       local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] *
       dVar125;
  auVar123 = vfmadd231sd_avx512f(auVar225,auVar122,auVar219);
  auVar123 = vfmadd231sd_fma(auVar123,auVar126,auVar230);
  auVar168._8_8_ = 0;
  auVar168._0_8_ =
       local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] *
       dVar125;
  auVar122 = vfmadd231sd_avx512f(auVar168,auVar209,auVar122);
  auVar126 = vfmadd231sd_fma(auVar122,auVar128,auVar126);
  (this->q_4).m_data[0] = dVar194 + auVar126._0_8_ + auVar126._0_8_;
  (this->q_4).m_data[1] = dVar146 + auVar123._0_8_ + auVar123._0_8_;
  (this->q_4).m_data[2] = dVar164 + auVar121._0_8_ + auVar121._0_8_;
  ChFrameMoving<double>::Compute_Adt(pCVar115,&local_200);
  auVar129._8_8_ = 0;
  auVar129._0_8_ = (this->PQw_dt).m_data[0];
  dVar125 = (this->PQw_dt).m_data[1];
  auVar169._8_8_ = 0;
  auVar169._0_8_ = (this->PQw_dt).m_data[2];
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar182._8_8_ = 0;
  auVar182._0_8_ =
       dVar125 * local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
  auVar126 = vfmadd231sd_fma(auVar182,auVar129,auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar126 = vfmadd231sd_fma(auVar126,auVar169,auVar18);
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar199._8_8_ = 0;
  auVar199._0_8_ =
       dVar125 * local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
  auVar121 = vfmadd231sd_fma(auVar199,auVar129,auVar19);
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar121 = vfmadd231sd_fma(auVar121,auVar169,auVar20);
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar149._8_8_ = 0;
  auVar149._0_8_ =
       dVar125 * local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
  auVar123 = vfmadd231sd_fma(auVar149,auVar129,auVar21);
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar123 = vfmadd231sd_fma(auVar123,auVar169,auVar22);
  pCVar116 = (this->super_ChLink).Body2;
  pCVar113 = this->marker2;
  dVar125 = auVar123._0_8_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       *(double *)
        ((long)&(pCVar113->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar130._8_8_ = 0;
  auVar130._0_8_ =
       dVar125 * *(double *)
                  ((long)&(pCVar113->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x28);
  auVar123 = vfmadd231sd_fma(auVar130,auVar121,auVar23);
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       *(double *)
        ((long)&(pCVar113->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar123 = vfmadd231sd_fma(auVar123,auVar126,auVar24);
  dVar164 = auVar123._0_8_ + auVar123._0_8_ + (this->q_4).m_data[2];
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       *(double *)
        ((long)&(pCVar113->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 8);
  auVar170._8_8_ = 0;
  auVar170._0_8_ =
       dVar125 * *(double *)
                  ((long)&(pCVar113->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x20);
  auVar123 = vfmadd231sd_fma(auVar170,auVar121,auVar25);
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       *(double *)
        ((long)&(pCVar113->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x38
        );
  auVar123 = vfmadd231sd_fma(auVar123,auVar126,auVar26);
  dVar146 = auVar123._0_8_ + auVar123._0_8_ + (this->q_4).m_data[1];
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       (pCVar113->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar150._8_8_ = 0;
  auVar150._0_8_ =
       dVar125 * *(double *)
                  ((long)&(pCVar113->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x18);
  auVar121 = vfmadd231sd_fma(auVar150,auVar121,auVar27);
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       *(double *)
        ((long)&(pCVar113->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x30
        );
  auVar126 = vfmadd231sd_fma(auVar121,auVar126,auVar28);
  dVar194 = auVar126._0_8_ + auVar126._0_8_ + (this->q_4).m_data[0];
  (this->q_4).m_data[0] = dVar194;
  (this->q_4).m_data[1] = dVar146;
  (this->q_4).m_data[2] = dVar164;
  auVar183._8_8_ = 0;
  auVar183._0_8_ = (this->PQw).m_data[0];
  dVar125 = (this->PQw).m_data[1];
  auVar210._8_8_ = 0;
  auVar210._0_8_ = (this->PQw).m_data[2];
  auVar29._8_8_ = 0;
  auVar29._0_8_ =
       *(double *)
        ((long)&(pCVar116->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar220._8_8_ = 0;
  auVar220._0_8_ =
       dVar125 * *(double *)
                  ((long)&(pCVar116->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x28);
  auVar126 = vfmadd231sd_fma(auVar220,auVar183,auVar29);
  auVar30._8_8_ = 0;
  auVar30._0_8_ =
       *(double *)
        ((long)&(pCVar116->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar126 = vfmadd231sd_fma(auVar126,auVar210,auVar30);
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       (pCVar116->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar226._8_8_ = 0;
  auVar226._0_8_ =
       dVar125 * *(double *)
                  ((long)&(pCVar116->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x18);
  auVar121 = vfmadd231sd_fma(auVar226,auVar183,auVar31);
  auVar32._8_8_ = 0;
  auVar32._0_8_ =
       *(double *)
        ((long)&(pCVar116->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x30
        );
  auVar121 = vfmadd231sd_fma(auVar121,auVar210,auVar32);
  auVar33._8_8_ = 0;
  auVar33._0_8_ =
       *(double *)
        ((long)&(pCVar116->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 8);
  auVar200._8_8_ = 0;
  auVar200._0_8_ =
       dVar125 * *(double *)
                  ((long)&(pCVar116->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x20);
  auVar123 = vfmadd231sd_fma(auVar200,auVar183,auVar33);
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       *(double *)
        ((long)&(pCVar116->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x38
        );
  auVar123 = vfmadd231sd_fma(auVar123,auVar210,auVar34);
  dVar125 = auVar123._0_8_;
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       local_f8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar211._8_8_ = 0;
  auVar211._0_8_ =
       dVar125 * local_f8.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
  auVar123 = vfmadd231sd_fma(auVar211,auVar121,auVar35);
  auVar36._8_8_ = 0;
  auVar36._0_8_ =
       local_f8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar123 = vfmadd231sd_fma(auVar123,auVar126,auVar36);
  auVar37._8_8_ = 0;
  auVar37._0_8_ =
       local_f8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar212._8_8_ = 0;
  auVar212._0_8_ =
       dVar125 * local_f8.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
  auVar122 = vfmadd231sd_fma(auVar212,auVar121,auVar37);
  auVar38._8_8_ = 0;
  auVar38._0_8_ =
       local_f8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar122 = vfmadd231sd_fma(auVar122,auVar126,auVar38);
  auVar39._8_8_ = 0;
  auVar39._0_8_ =
       local_f8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar201._8_8_ = 0;
  auVar201._0_8_ =
       dVar125 * local_f8.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
  auVar121 = vfmadd231sd_fma(auVar201,auVar121,auVar39);
  auVar40._8_8_ = 0;
  auVar40._0_8_ =
       local_f8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar126 = vfmadd231sd_fma(auVar121,auVar126,auVar40);
  (this->q_4).m_data[0] = auVar126._0_8_ + dVar194;
  (this->q_4).m_data[1] = auVar122._0_8_ + dVar146;
  (this->q_4).m_data[2] = dVar164 + auVar123._0_8_;
  dVar125 = (this->PQw).m_data[1];
  auVar151._8_8_ = 0;
  auVar151._0_8_ = (this->PQw).m_data[2];
  auVar41._8_8_ = 0;
  auVar41._0_8_ =
       *(double *)
        ((long)&(pCVar116->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar171._8_8_ = 0;
  auVar171._0_8_ =
       dVar125 * *(double *)
                  ((long)&(pCVar116->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x28);
  auVar126 = vfmadd231sd_fma(auVar171,auVar183,auVar41);
  auVar42._8_8_ = 0;
  auVar42._0_8_ =
       *(double *)
        ((long)&(pCVar116->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar126 = vfmadd231sd_fma(auVar126,auVar151,auVar42);
  auVar43._8_8_ = 0;
  auVar43._0_8_ =
       (pCVar116->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar202._8_8_ = 0;
  auVar202._0_8_ =
       dVar125 * *(double *)
                  ((long)&(pCVar116->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x18);
  auVar121 = vfmadd231sd_fma(auVar202,auVar183,auVar43);
  auVar44._8_8_ = 0;
  auVar44._0_8_ =
       *(double *)
        ((long)&(pCVar116->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x30
        );
  auVar121 = vfmadd231sd_fma(auVar121,auVar151,auVar44);
  auVar45._8_8_ = 0;
  auVar45._0_8_ =
       *(double *)
        ((long)&(pCVar116->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 8);
  auVar131._8_8_ = 0;
  auVar131._0_8_ =
       dVar125 * *(double *)
                  ((long)&(pCVar116->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x20);
  auVar123 = vfmadd231sd_fma(auVar131,auVar183,auVar45);
  auVar46._8_8_ = 0;
  auVar46._0_8_ =
       *(double *)
        ((long)&(pCVar116->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x38
        );
  auVar123 = vfmadd231sd_fma(auVar123,auVar151,auVar46);
  dVar125 = auVar123._0_8_;
  auVar47._8_8_ = 0;
  auVar47._0_8_ =
       *(double *)
        ((long)&(pCVar113->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar152._8_8_ = 0;
  auVar152._0_8_ =
       dVar125 * *(double *)
                  ((long)&(pCVar113->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x28);
  auVar123 = vfmadd231sd_fma(auVar152,auVar121,auVar47);
  auVar48._8_8_ = 0;
  auVar48._0_8_ =
       *(double *)
        ((long)&(pCVar113->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar123 = vfmadd231sd_fma(auVar123,auVar126,auVar48);
  auVar49._8_8_ = 0;
  auVar49._0_8_ =
       *(double *)
        ((long)&(pCVar113->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 8);
  auVar184._8_8_ = 0;
  auVar184._0_8_ =
       dVar125 * *(double *)
                  ((long)&(pCVar113->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x20);
  auVar122 = vfmadd231sd_fma(auVar184,auVar121,auVar49);
  auVar50._8_8_ = 0;
  auVar50._0_8_ =
       *(double *)
        ((long)&(pCVar113->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x38
        );
  auVar122 = vfmadd231sd_fma(auVar122,auVar126,auVar50);
  auVar51._8_8_ = 0;
  auVar51._0_8_ =
       (pCVar113->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar132._8_8_ = 0;
  auVar132._0_8_ =
       dVar125 * *(double *)
                  ((long)&(pCVar113->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x18);
  auVar121 = vfmadd231sd_fma(auVar132,auVar121,auVar51);
  auVar52._8_8_ = 0;
  auVar52._0_8_ =
       *(double *)
        ((long)&(pCVar113->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x30
        );
  auVar126 = vfmadd231sd_fma(auVar121,auVar126,auVar52);
  (this->relM).pos.m_data[0] = auVar126._0_8_;
  (this->relM).pos.m_data[1] = auVar122._0_8_;
  (this->relM).pos.m_data[2] = auVar123._0_8_;
  Qconjugate(&(pCVar113->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  Qconjugate(&(this->marker2->Body->super_ChBodyFrame).super_ChFrameMoving<double>.
              super_ChFrame<double>.coord.rot);
  Qcross(&(this->marker1->Body->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>
          .coord.rot,&(this->marker1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  Qcross(&local_118,&local_138);
  Qcross(&local_198,&local_1b8);
  local_210 = &(this->relM).rot;
  if (&local_200 != (ChMatrix33<double> *)local_210) {
    (this->relM).rot.m_data[0] =
         local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    (this->relM).rot.m_data[1] =
         local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    (this->relM).rot.m_data[2] =
         local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    (this->relM).rot.m_data[3] =
         local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  }
  auVar133._8_8_ = 0;
  auVar133._0_8_ = (this->PQw).m_data[0];
  dVar125 = (this->PQw).m_data[1];
  auVar172._8_8_ = 0;
  auVar172._0_8_ = (this->PQw).m_data[2];
  pCVar115 = &((this->super_ChLink).Body2)->super_ChFrameMoving<double>;
  pCVar113 = this->marker2;
  auVar53._8_8_ = 0;
  auVar53._0_8_ =
       *(double *)
        ((long)(pCVar115->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x10);
  auVar185._8_8_ = 0;
  auVar185._0_8_ =
       dVar125 * *(double *)
                  ((long)(pCVar115->super_ChFrame<double>).Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + 0x28);
  auVar126 = vfmadd231sd_fma(auVar185,auVar133,auVar53);
  auVar54._8_8_ = 0;
  auVar54._0_8_ =
       *(double *)
        ((long)(pCVar115->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x40);
  auVar126 = vfmadd231sd_fma(auVar126,auVar172,auVar54);
  auVar55._8_8_ = 0;
  auVar55._0_8_ =
       (pCVar115->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar203._8_8_ = 0;
  auVar203._0_8_ =
       dVar125 * *(double *)
                  ((long)(pCVar115->super_ChFrame<double>).Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + 0x18);
  auVar121 = vfmadd231sd_fma(auVar203,auVar133,auVar55);
  auVar56._8_8_ = 0;
  auVar56._0_8_ =
       *(double *)
        ((long)(pCVar115->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x30);
  auVar121 = vfmadd231sd_fma(auVar121,auVar172,auVar56);
  auVar57._8_8_ = 0;
  auVar57._0_8_ =
       *(double *)
        ((long)(pCVar115->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        8);
  auVar153._8_8_ = 0;
  auVar153._0_8_ =
       dVar125 * *(double *)
                  ((long)(pCVar115->super_ChFrame<double>).Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + 0x20);
  auVar123 = vfmadd231sd_fma(auVar153,auVar133,auVar57);
  auVar58._8_8_ = 0;
  auVar58._0_8_ =
       *(double *)
        ((long)(pCVar115->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x38);
  auVar123 = vfmadd231sd_fma(auVar123,auVar172,auVar58);
  dVar125 = auVar123._0_8_;
  auVar59._8_8_ = 0;
  auVar59._0_8_ =
       local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar134._8_8_ = 0;
  auVar134._0_8_ =
       dVar125 * local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
  auVar123 = vfmadd231sd_fma(auVar134,auVar121,auVar59);
  auVar60._8_8_ = 0;
  auVar60._0_8_ =
       local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar123 = vfmadd231sd_fma(auVar123,auVar126,auVar60);
  local_150 = auVar123._0_8_;
  auVar61._8_8_ = 0;
  auVar61._0_8_ =
       local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar135._8_8_ = 0;
  auVar135._0_8_ =
       dVar125 * local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
  auVar123 = vfmadd231sd_fma(auVar135,auVar121,auVar61);
  auVar62._8_8_ = 0;
  auVar62._0_8_ =
       local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar123 = vfmadd231sd_fma(auVar123,auVar126,auVar62);
  local_148 = auVar123._0_8_;
  auVar63._8_8_ = 0;
  auVar63._0_8_ =
       local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar136._8_8_ = 0;
  auVar136._0_8_ =
       dVar125 * local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
  auVar121 = vfmadd231sd_fma(auVar136,auVar121,auVar63);
  auVar64._8_8_ = 0;
  auVar64._0_8_ =
       local_2a0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar126 = vfmadd231sd_fma(auVar121,auVar126,auVar64);
  local_140 = auVar126._0_8_;
  ChFrameMoving<double>::Compute_Adt(pCVar115,&local_200);
  auVar137._8_8_ = 0;
  auVar137._0_8_ = (this->PQw).m_data[2];
  auVar154._8_8_ = 0;
  auVar154._0_8_ = (this->PQw).m_data[0];
  dVar125 = (this->PQw).m_data[1];
  auVar65._8_8_ = 0;
  auVar65._0_8_ =
       local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar186._8_8_ = 0;
  auVar186._0_8_ =
       dVar125 * local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
  auVar126 = vfmadd231sd_fma(auVar186,auVar154,auVar65);
  auVar66._8_8_ = 0;
  auVar66._0_8_ =
       local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar126 = vfmadd231sd_fma(auVar126,auVar137,auVar66);
  auVar67._8_8_ = 0;
  auVar67._0_8_ =
       local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar204._8_8_ = 0;
  auVar204._0_8_ =
       dVar125 * local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
  auVar121 = vfmadd231sd_fma(auVar204,auVar154,auVar67);
  auVar68._8_8_ = 0;
  auVar68._0_8_ =
       local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar121 = vfmadd231sd_fma(auVar121,auVar137,auVar68);
  auVar69._8_8_ = 0;
  auVar69._0_8_ =
       local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar173._8_8_ = 0;
  auVar173._0_8_ =
       dVar125 * local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
  auVar123 = vfmadd231sd_fma(auVar173,auVar154,auVar69);
  auVar70._8_8_ = 0;
  auVar70._0_8_ =
       local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar123 = vfmadd231sd_fma(auVar123,auVar137,auVar70);
  dVar164 = auVar123._0_8_;
  auVar71._8_8_ = 0;
  auVar71._0_8_ =
       *(double *)
        ((long)&(pCVar113->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar138._8_8_ = 0;
  auVar138._0_8_ =
       dVar164 * *(double *)
                  ((long)&(pCVar113->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x28);
  auVar123 = vfmadd231sd_fma(auVar138,auVar121,auVar71);
  auVar72._8_8_ = 0;
  auVar72._0_8_ =
       *(double *)
        ((long)&(pCVar113->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar123 = vfmadd231sd_fma(auVar123,auVar126,auVar72);
  pCVar116 = (this->super_ChLink).Body2;
  pCVar114 = this->marker2;
  auVar155._8_8_ = 0;
  auVar155._0_8_ = (this->PQw_dt).m_data[2];
  auVar213._8_8_ = 0;
  auVar213._0_8_ = (this->PQw_dt).m_data[0];
  dVar125 = (this->PQw_dt).m_data[1];
  auVar73._8_8_ = 0;
  auVar73._0_8_ =
       *(double *)
        ((long)&(pCVar116->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar227._8_8_ = 0;
  auVar227._0_8_ =
       dVar125 * *(double *)
                  ((long)&(pCVar116->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x28);
  auVar122 = vfmadd231sd_fma(auVar227,auVar213,auVar73);
  auVar74._8_8_ = 0;
  auVar74._0_8_ =
       *(double *)
        ((long)&(pCVar116->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar122 = vfmadd231sd_fma(auVar122,auVar155,auVar74);
  auVar75._8_8_ = 0;
  auVar75._0_8_ =
       (pCVar116->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar231._8_8_ = 0;
  auVar231._0_8_ =
       dVar125 * *(double *)
                  ((long)&(pCVar116->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x18);
  auVar165 = vfmadd231sd_fma(auVar231,auVar213,auVar75);
  auVar76._8_8_ = 0;
  auVar76._0_8_ =
       *(double *)
        ((long)&(pCVar116->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x30
        );
  auVar165 = vfmadd231sd_fma(auVar165,auVar155,auVar76);
  auVar77._8_8_ = 0;
  auVar77._0_8_ =
       *(double *)
        ((long)&(pCVar116->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 8);
  auVar221._8_8_ = 0;
  auVar221._0_8_ =
       dVar125 * *(double *)
                  ((long)&(pCVar116->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x20);
  auVar195 = vfmadd231sd_fma(auVar221,auVar213,auVar77);
  auVar78._8_8_ = 0;
  auVar78._0_8_ =
       *(double *)
        ((long)&(pCVar116->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x38
        );
  auVar195 = vfmadd231sd_fma(auVar195,auVar155,auVar78);
  dVar125 = auVar195._0_8_;
  auVar79._8_8_ = 0;
  auVar79._0_8_ =
       *(double *)
        ((long)&(pCVar114->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar156._8_8_ = 0;
  auVar156._0_8_ =
       dVar125 * *(double *)
                  ((long)&(pCVar114->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x28);
  auVar195 = vfmadd231sd_fma(auVar156,auVar165,auVar79);
  auVar80._8_8_ = 0;
  auVar80._0_8_ =
       *(double *)
        ((long)&(pCVar114->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar195 = vfmadd231sd_fma(auVar195,auVar122,auVar80);
  auVar81._8_8_ = 0;
  auVar81._0_8_ =
       *(double *)
        ((long)&(pCVar113->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 8);
  auVar157._8_8_ = 0;
  auVar157._0_8_ =
       dVar164 * *(double *)
                  ((long)&(pCVar113->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x20);
  auVar2 = vfmadd231sd_fma(auVar157,auVar121,auVar81);
  auVar82._8_8_ = 0;
  auVar82._0_8_ =
       *(double *)
        ((long)&(pCVar113->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x38
        );
  auVar2 = vfmadd231sd_fma(auVar2,auVar126,auVar82);
  auVar83._8_8_ = 0;
  auVar83._0_8_ =
       *(double *)
        ((long)&(pCVar114->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 8);
  auVar214._8_8_ = 0;
  auVar214._0_8_ =
       dVar125 * *(double *)
                  ((long)&(pCVar114->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x20);
  auVar3 = vfmadd231sd_fma(auVar214,auVar165,auVar83);
  auVar84._8_8_ = 0;
  auVar84._0_8_ =
       *(double *)
        ((long)&(pCVar114->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x38
        );
  auVar3 = vfmadd231sd_fma(auVar3,auVar122,auVar84);
  auVar85._8_8_ = 0;
  auVar85._0_8_ =
       (pCVar113->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar174._8_8_ = 0;
  auVar174._0_8_ =
       dVar164 * *(double *)
                  ((long)&(pCVar113->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x18);
  auVar121 = vfmadd231sd_fma(auVar174,auVar121,auVar85);
  auVar86._8_8_ = 0;
  auVar86._0_8_ =
       *(double *)
        ((long)&(pCVar113->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x30
        );
  auVar126 = vfmadd231sd_fma(auVar121,auVar126,auVar86);
  auVar87._8_8_ = 0;
  auVar87._0_8_ =
       (pCVar114->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar187._8_8_ = 0;
  auVar187._0_8_ =
       dVar125 * *(double *)
                  ((long)&(pCVar114->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x18);
  auVar121 = vfmadd231sd_fma(auVar187,auVar165,auVar87);
  auVar88._8_8_ = 0;
  auVar88._0_8_ =
       *(double *)
        ((long)&(pCVar114->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x30
        );
  auVar121 = vfmadd231sd_fma(auVar121,auVar122,auVar88);
  (this->relM_dt).pos.m_data[0] = auVar126._0_8_ + local_140 + auVar121._0_8_;
  (this->relM_dt).pos.m_data[1] = auVar2._0_8_ + local_148 + auVar3._0_8_;
  (this->relM_dt).pos.m_data[2] = auVar123._0_8_ + local_150 + auVar195._0_8_;
  Qadd(&this->q_AD,local_208);
  if (&local_200 != (ChMatrix33<double> *)&(this->relM_dt).rot) {
    (this->relM_dt).rot.m_data[0] =
         local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    (this->relM_dt).rot.m_data[1] =
         local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    (this->relM_dt).rot.m_data[2] =
         local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    (this->relM_dt).rot.m_data[3] =
         local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  }
  pCVar113 = this->marker2;
  ChFrameMoving<double>::Compute_Adtdt
            (&((this->super_ChLink).Body2)->super_ChFrameMoving<double>,&local_200);
  auVar139._8_8_ = 0;
  auVar139._0_8_ = (this->PQw).m_data[0];
  dVar125 = (this->PQw).m_data[1];
  auVar175._8_8_ = 0;
  auVar175._0_8_ = (this->PQw).m_data[2];
  pCVar116 = (this->super_ChLink).Body2;
  pCVar114 = this->marker2;
  auVar188._8_8_ = 0;
  auVar188._0_8_ = (this->PQw_dtdt).m_data[0];
  dVar164 = (this->PQw_dtdt).m_data[1];
  auVar215._8_8_ = 0;
  auVar215._0_8_ = (this->PQw_dtdt).m_data[2];
  auVar89._8_8_ = 0;
  auVar89._0_8_ =
       local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar222._8_8_ = 0;
  auVar222._0_8_ =
       dVar125 * local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
  auVar126 = vfmadd231sd_fma(auVar222,auVar139,auVar89);
  auVar90._8_8_ = 0;
  auVar90._0_8_ =
       local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar126 = vfmadd231sd_fma(auVar126,auVar175,auVar90);
  auVar91._8_8_ = 0;
  auVar91._0_8_ =
       local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar228._8_8_ = 0;
  auVar228._0_8_ =
       dVar125 * local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
  auVar121 = vfmadd231sd_fma(auVar228,auVar139,auVar91);
  auVar92._8_8_ = 0;
  auVar92._0_8_ =
       local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar121 = vfmadd231sd_fma(auVar121,auVar175,auVar92);
  auVar93._8_8_ = 0;
  auVar93._0_8_ =
       local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar158._8_8_ = 0;
  auVar158._0_8_ =
       dVar125 * local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
  auVar123 = vfmadd231sd_fma(auVar158,auVar139,auVar93);
  auVar94._8_8_ = 0;
  auVar94._0_8_ =
       local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar123 = vfmadd231sd_fma(auVar123,auVar175,auVar94);
  dVar146 = auVar123._0_8_;
  auVar95._8_8_ = 0;
  auVar95._0_8_ =
       *(double *)
        ((long)&(pCVar113->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar140._8_8_ = 0;
  auVar140._0_8_ =
       dVar146 * *(double *)
                  ((long)&(pCVar113->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x28);
  auVar123 = vfmadd231sd_fma(auVar140,auVar121,auVar95);
  auVar96._8_8_ = 0;
  auVar96._0_8_ =
       *(double *)
        ((long)&(pCVar113->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar123 = vfmadd231sd_fma(auVar123,auVar126,auVar96);
  auVar97._8_8_ = 0;
  auVar97._0_8_ =
       *(double *)
        ((long)&(pCVar116->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar176._8_8_ = 0;
  auVar176._0_8_ =
       dVar164 * *(double *)
                  ((long)&(pCVar116->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x28);
  auVar122 = vfmadd231sd_fma(auVar176,auVar188,auVar97);
  auVar98._8_8_ = 0;
  auVar98._0_8_ =
       *(double *)
        ((long)&(pCVar116->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar122 = vfmadd231sd_fma(auVar122,auVar215,auVar98);
  auVar99._8_8_ = 0;
  auVar99._0_8_ =
       (pCVar116->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar232._8_8_ = 0;
  auVar232._0_8_ =
       dVar164 * *(double *)
                  ((long)&(pCVar116->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x18);
  auVar165 = vfmadd231sd_fma(auVar232,auVar188,auVar99);
  auVar100._8_8_ = 0;
  auVar100._0_8_ =
       *(double *)
        ((long)&(pCVar116->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x30
        );
  auVar165 = vfmadd231sd_fma(auVar165,auVar215,auVar100);
  auVar101._8_8_ = 0;
  auVar101._0_8_ =
       *(double *)
        ((long)&(pCVar116->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 8);
  auVar205._8_8_ = 0;
  auVar205._0_8_ =
       dVar164 * *(double *)
                  ((long)&(pCVar116->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x20);
  auVar195 = vfmadd231sd_fma(auVar205,auVar188,auVar101);
  auVar102._8_8_ = 0;
  auVar102._0_8_ =
       *(double *)
        ((long)&(pCVar116->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x38
        );
  auVar195 = vfmadd231sd_fma(auVar195,auVar215,auVar102);
  dVar194 = auVar195._0_8_;
  auVar103._8_8_ = 0;
  auVar103._0_8_ =
       *(double *)
        ((long)&(pCVar114->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar189._8_8_ = 0;
  auVar189._0_8_ =
       dVar194 * *(double *)
                  ((long)&(pCVar114->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x28);
  auVar195 = vfmadd231sd_fma(auVar189,auVar165,auVar103);
  auVar104._8_8_ = 0;
  auVar104._0_8_ =
       *(double *)
        ((long)&(pCVar114->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar195 = vfmadd231sd_fma(auVar195,auVar122,auVar104);
  dVar125 = (this->q_4).m_data[2];
  auVar105._8_8_ = 0;
  auVar105._0_8_ =
       *(double *)
        ((long)&(pCVar113->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 8);
  auVar190._8_8_ = 0;
  auVar190._0_8_ =
       dVar146 * *(double *)
                  ((long)&(pCVar113->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x20);
  auVar2 = vfmadd231sd_fma(auVar190,auVar121,auVar105);
  auVar106._8_8_ = 0;
  auVar106._0_8_ =
       *(double *)
        ((long)&(pCVar113->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x38
        );
  auVar2 = vfmadd231sd_fma(auVar2,auVar126,auVar106);
  auVar107._8_8_ = 0;
  auVar107._0_8_ =
       *(double *)
        ((long)&(pCVar114->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 8);
  auVar216._8_8_ = 0;
  auVar216._0_8_ =
       dVar194 * *(double *)
                  ((long)&(pCVar114->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x20);
  auVar3 = vfmadd231sd_fma(auVar216,auVar165,auVar107);
  auVar108._8_8_ = 0;
  auVar108._0_8_ =
       *(double *)
        ((long)&(pCVar114->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x38
        );
  auVar3 = vfmadd231sd_fma(auVar3,auVar122,auVar108);
  dVar164 = (this->q_4).m_data[1];
  auVar109._8_8_ = 0;
  auVar109._0_8_ =
       (pCVar113->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar159._8_8_ = 0;
  auVar159._0_8_ =
       dVar146 * *(double *)
                  ((long)&(pCVar113->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x18);
  auVar121 = vfmadd231sd_fma(auVar159,auVar121,auVar109);
  auVar110._8_8_ = 0;
  auVar110._0_8_ =
       *(double *)
        ((long)&(pCVar113->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x30
        );
  auVar126 = vfmadd231sd_fma(auVar121,auVar126,auVar110);
  auVar111._8_8_ = 0;
  auVar111._0_8_ =
       (pCVar114->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar206._8_8_ = 0;
  auVar206._0_8_ =
       dVar194 * *(double *)
                  ((long)&(pCVar114->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x18);
  auVar121 = vfmadd231sd_fma(auVar206,auVar165,auVar111);
  auVar112._8_8_ = 0;
  auVar112._0_8_ =
       *(double *)
        ((long)&(pCVar114->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x30
        );
  auVar121 = vfmadd231sd_fma(auVar121,auVar122,auVar112);
  (this->relM_dtdt).pos.m_data[0] = auVar126._0_8_ + auVar121._0_8_ + (this->q_4).m_data[0];
  (this->relM_dtdt).pos.m_data[1] = auVar2._0_8_ + auVar3._0_8_ + dVar164;
  (this->relM_dtdt).pos.m_data[2] = auVar123._0_8_ + auVar195._0_8_ + dVar125;
  Qconjugate(&(pCVar114->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  Qconjugate(&(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).coord_dtdt.rot);
  Qcross(&(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.coord.
          rot,&(this->marker1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  Qcross(&local_118,&local_138);
  Qcross(&local_198,&local_1b8);
  local_178.m_data[0] =
       local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_178.m_data[1] =
       local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_178.m_data[2] =
       local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  local_178.m_data[3] =
       local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  Qadd(local_238,&local_178);
  pCVar163 = &(this->relM_dtdt).rot;
  if (&local_200 != (ChMatrix33<double> *)pCVar163) {
    (this->relM_dtdt).rot.m_data[0] =
         local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    (this->relM_dtdt).rot.m_data[1] =
         local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    (this->relM_dtdt).rot.m_data[2] =
         local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    (this->relM_dtdt).rot.m_data[3] =
         local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  }
  Qconjugate(&(this->marker2->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  Qconjugate(&(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
              coord.rot);
  Qcross(&(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).coord_dtdt.rot,
         &(this->marker1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  Qcross(&local_118,&local_138);
  Qcross(&local_198,&local_1b8);
  local_178.m_data[0] =
       local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_178.m_data[1] =
       local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_178.m_data[2] =
       local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  local_178.m_data[3] =
       local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  Qadd(pCVar163,&local_178);
  if (&local_200 != (ChMatrix33<double> *)pCVar163) {
    (this->relM_dtdt).rot.m_data[0] =
         local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    (this->relM_dtdt).rot.m_data[1] =
         local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    (this->relM_dtdt).rot.m_data[2] =
         local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    (this->relM_dtdt).rot.m_data[3] =
         local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  }
  Q_to_AngAxis(local_210,&this->relAngle,&this->relAxis);
  dVar125 = (this->relAxis).m_data[2];
  auVar141._8_8_ = 0;
  auVar141._0_8_ = dVar125;
  if (dVar125 < 0.0) {
    auVar160._8_8_ = 0;
    auVar160._0_8_ = (this->relAxis).m_data[1];
    auVar126 = vunpcklpd_avx(auVar160,auVar141);
    auVar124._0_8_ = this->relAngle;
    auVar124._8_24_ = *(undefined1 (*) [24])&this->relAxis;
    auVar145._16_16_ = auVar126;
    auVar145._0_16_ = auVar124._0_16_;
    auVar117._8_8_ = 0x8000000000000000;
    auVar117._0_8_ = 0x8000000000000000;
    auVar117._16_8_ = 0x8000000000000000;
    auVar117._24_8_ = 0x8000000000000000;
    auVar124 = vxorpd_avx512vl(auVar145,auVar117);
    this->relAngle = (double)auVar124._0_8_;
    this->relAxis = (ChVector<double>)auVar124._8_24_;
  }
  dVar125 = this->relAngle;
  dVar164 = (this->relAxis).m_data[2];
  dVar146 = (this->relAxis).m_data[1];
  (this->relRotaxis).m_data[0] = dVar125 * (this->relAxis).m_data[0];
  (this->relRotaxis).m_data[1] = dVar125 * dVar146;
  (this->relRotaxis).m_data[2] = dVar125 * dVar164;
  dVar125 = (this->relM).rot.m_data[0];
  dVar164 = (this->relM).rot.m_data[1];
  dVar125 = dVar125 + dVar125;
  dVar164 = dVar164 + dVar164;
  dVar146 = (this->relM).rot.m_data[2];
  dVar146 = dVar146 + dVar146;
  dVar194 = (this->relM).rot.m_data[3];
  dVar194 = dVar194 + dVar194;
  auVar207._8_8_ = 0;
  auVar207._0_8_ = (this->relM_dt).rot.m_data[3];
  auVar217._8_8_ = 0;
  auVar217._0_8_ = (this->relM_dt).rot.m_data[2];
  auVar223._8_8_ = 0;
  auVar223._0_8_ = (this->relM_dt).rot.m_data[0];
  dVar1 = (this->relM_dt).rot.m_data[1];
  auVar191._8_8_ = 0;
  auVar191._0_8_ = dVar194;
  auVar233._8_8_ = 0;
  auVar233._0_8_ = dVar1 * dVar146;
  auVar126 = vfnmsub231sd_fma(auVar233,auVar191,auVar223);
  auVar161._8_8_ = 0;
  auVar161._0_8_ = dVar164;
  auVar126 = vfmadd231sd_fma(auVar126,auVar161,auVar217);
  auVar142._8_8_ = 0;
  auVar142._0_8_ = dVar125;
  auVar126 = vfmadd231sd_fma(auVar126,auVar142,auVar207);
  auVar177._8_8_ = 0;
  auVar177._0_8_ = dVar146;
  auVar236._8_8_ = 0;
  auVar236._0_8_ = dVar194 * dVar1;
  auVar121 = vfnmadd231sd_fma(auVar236,auVar177,auVar223);
  auVar121 = vfmadd231sd_fma(auVar121,auVar142,auVar217);
  auVar123 = vfnmadd231sd_fma(auVar121,auVar161,auVar207);
  auVar162._8_8_ = 0;
  auVar162._0_8_ = dVar164;
  auVar229._8_8_ = 0;
  auVar229._0_8_ = dVar125 * dVar1;
  auVar121 = vfnmadd231sd_fma(auVar229,auVar162,auVar223);
  auVar121 = vfnmadd231sd_fma(auVar121,auVar191,auVar217);
  auVar121 = vfmadd231sd_fma(auVar121,auVar177,auVar207);
  (this->relWvel).m_data[0] = auVar121._0_8_;
  (this->relWvel).m_data[1] = auVar123._0_8_;
  (this->relWvel).m_data[2] = auVar126._0_8_;
  auVar208._8_8_ = 0;
  auVar208._0_8_ = (this->relM_dtdt).rot.m_data[3];
  auVar218._8_8_ = 0;
  auVar218._0_8_ = (this->relM_dtdt).rot.m_data[2];
  auVar224._8_8_ = 0;
  auVar224._0_8_ = (this->relM_dtdt).rot.m_data[0];
  dVar164 = (this->relM_dtdt).rot.m_data[1];
  auVar192._8_8_ = 0;
  auVar192._0_8_ = dVar194;
  auVar234._8_8_ = 0;
  auVar234._0_8_ = dVar164 * dVar146;
  auVar126 = vfnmsub231sd_fma(auVar234,auVar192,auVar224);
  auVar126 = vfmadd231sd_fma(auVar126,auVar162,auVar218);
  auVar143._8_8_ = 0;
  auVar143._0_8_ = dVar125;
  auVar126 = vfmadd231sd_fma(auVar126,auVar143,auVar208);
  auVar237._8_8_ = 0;
  auVar237._0_8_ = dVar194 * dVar164;
  auVar121 = vfnmadd231sd_fma(auVar237,auVar177,auVar224);
  auVar121 = vfmadd231sd_fma(auVar121,auVar143,auVar218);
  auVar123 = vfnmadd231sd_fma(auVar121,auVar162,auVar208);
  auVar144._8_8_ = 0;
  auVar144._0_8_ = dVar125 * dVar164;
  auVar121 = vfnmadd231sd_fma(auVar144,auVar162,auVar224);
  auVar121 = vfnmadd231sd_fma(auVar121,auVar192,auVar218);
  auVar121 = vfmadd231sd_fma(auVar121,auVar177,auVar208);
  (this->relWacc).m_data[0] = auVar121._0_8_;
  (this->relWacc).m_data[1] = auVar123._0_8_;
  (this->relWacc).m_data[2] = auVar126._0_8_;
  return;
}

Assistant:

void ChLinkMarkers::UpdateRelMarkerCoords() {
    PQw = Vsub(marker1->GetAbsCoord().pos, marker2->GetAbsCoord().pos);
    PQw_dt = Vsub(marker1->GetAbsCoord_dt().pos, marker2->GetAbsCoord_dt().pos);
    PQw_dtdt = Vsub(marker1->GetAbsCoord_dtdt().pos, marker2->GetAbsCoord_dtdt().pos);

    dist = Vlength(PQw);                 // distance between origins, modulus
    dist_dt = Vdot(Vnorm(PQw), PQw_dt);  // speed between origins, modulus.

    Quaternion qtemp1;

    Quaternion temp1 = marker1->GetCoord_dt().rot;
    Quaternion temp2 = marker2->GetCoord_dt().rot;

    if (Qnotnull(temp1) || Qnotnull(temp2)) {
        q_AD =  //  q'qqq + qqqq'
            Qadd(Qcross(Qconjugate(marker2->GetCoord_dt().rot),
                        Qcross(Qconjugate(marker2->GetBody()->GetCoord().rot),
                               Qcross((marker1->GetBody()->GetCoord().rot), (marker1->GetCoord().rot)))),
                 Qcross(Qconjugate(marker2->GetCoord().rot),
                        Qcross(Qconjugate(marker2->GetBody()->GetCoord().rot),
                               Qcross((marker1->GetBody()->GetCoord().rot), (marker1->GetCoord_dt().rot)))));
    } else
        q_AD = QNULL;

    q_BC =  // qq'qq + qqq'q
        Qadd(Qcross(Qconjugate(marker2->GetCoord().rot),
                    Qcross(Qconjugate(marker2->GetBody()->GetCoord_dt().rot),
                           Qcross((marker1->GetBody()->GetCoord().rot), (marker1->GetCoord().rot)))),
             Qcross(Qconjugate(marker2->GetCoord().rot),
                    Qcross(Qconjugate(marker2->GetBody()->GetCoord().rot),
                           Qcross((marker1->GetBody()->GetCoord_dt().rot), (marker1->GetCoord().rot)))));

    // q_8 = q''qqq + 2q'q'qq + 2q'qq'q + 2q'qqq'
    //     + 2qq'q'q + 2qq'qq' + 2qqq'q' + qqqq''
    temp2 = marker2->GetCoord_dtdt().rot;
    if (Qnotnull(temp2))
        q_8 = Qcross(Qconjugate(marker2->GetCoord_dtdt().rot),
                     Qcross(Qconjugate(Body2->GetCoord().rot),
                            Qcross(Body1->GetCoord().rot,
                                   marker1->GetCoord().rot)));  // q_dtdt'm2 * q'o2 * q,o1 * q,m1
    else
        q_8 = QNULL;
    temp1 = marker1->GetCoord_dtdt().rot;
    if (Qnotnull(temp1)) {
        qtemp1 = Qcross(Qconjugate(marker2->GetCoord().rot),
                        Qcross(Qconjugate(Body2->GetCoord().rot),
                               Qcross(Body1->GetCoord().rot,
                                      marker1->GetCoord_dtdt().rot)));  // q'm2 * q'o2 * q,o1 * q_dtdt,m1
        q_8 = Qadd(q_8, qtemp1);
    }
    temp2 = marker2->GetCoord_dt().rot;
    if (Qnotnull(temp2)) {
        qtemp1 = Qcross(
            Qconjugate(marker2->GetCoord_dt().rot),
            Qcross(Qconjugate(Body2->GetCoord_dt().rot), Qcross(Body1->GetCoord().rot, marker1->GetCoord().rot)));
        qtemp1 = Qscale(qtemp1, 2);  // 2( q_dt'm2 * q_dt'o2 * q,o1 * q,m1)
        q_8 = Qadd(q_8, qtemp1);
    }
    temp2 = marker2->GetCoord_dt().rot;
    if (Qnotnull(temp2)) {
        qtemp1 = Qcross(
            Qconjugate(marker2->GetCoord_dt().rot),
            Qcross(Qconjugate(Body2->GetCoord().rot), Qcross(Body1->GetCoord_dt().rot, marker1->GetCoord().rot)));
        qtemp1 = Qscale(qtemp1, 2);  // 2( q_dt'm2 * q'o2 * q_dt,o1 * q,m1)
        q_8 = Qadd(q_8, qtemp1);
    }
    temp1 = marker1->GetCoord_dt().rot;
    temp2 = marker2->GetCoord_dt().rot;
    if (Qnotnull(temp2) && Qnotnull(temp1)) {
        qtemp1 = Qcross(
            Qconjugate(marker2->GetCoord_dt().rot),
            Qcross(Qconjugate(Body2->GetCoord().rot), Qcross(Body1->GetCoord().rot, marker1->GetCoord_dt().rot)));
        qtemp1 = Qscale(qtemp1, 2);  // 2( q_dt'm2 * q'o2 * q,o1 * q_dt,m1)
        q_8 = Qadd(q_8, qtemp1);
    }

    qtemp1 =
        Qcross(Qconjugate(marker2->GetCoord().rot),
               Qcross(Qconjugate(Body2->GetCoord_dt().rot), Qcross(Body1->GetCoord_dt().rot, marker1->GetCoord().rot)));
    qtemp1 = Qscale(qtemp1, 2);  // 2( q'm2 * q_dt'o2 * q_dt,o1 * q,m1)
    q_8 = Qadd(q_8, qtemp1);
    temp1 = marker1->GetCoord_dt().rot;
    if (Qnotnull(temp1)) {
        qtemp1 = Qcross(
            Qconjugate(marker2->GetCoord().rot),
            Qcross(Qconjugate(Body2->GetCoord_dt().rot), Qcross(Body1->GetCoord().rot, marker1->GetCoord_dt().rot)));
        qtemp1 = Qscale(qtemp1, 2);  // 2( q'm2 * q_dt'o2 * q,o1 * q_dt,m1)
        q_8 = Qadd(q_8, qtemp1);
    }
    temp1 = marker1->GetCoord_dt().rot;
    if (Qnotnull(temp1)) {
        qtemp1 = Qcross(
            Qconjugate(marker2->GetCoord().rot),
            Qcross(Qconjugate(Body2->GetCoord().rot), Qcross(Body1->GetCoord_dt().rot, marker1->GetCoord_dt().rot)));
        qtemp1 = Qscale(qtemp1, 2);  // 2( q'm2 * q'o2 * q_dt,o1 * q_dt,m1)
        q_8 = Qadd(q_8, qtemp1);
    }

    // q_4 = [Adtdt]'[A]'q + 2[Adt]'[Adt]'q
    //       + 2[Adt]'[A]'qdt + 2[A]'[Adt]'qdt
    ChMatrix33<> m2_Rel_A_dt;
    marker2->Compute_Adt(m2_Rel_A_dt);
    ChMatrix33<> m2_Rel_A_dtdt;
    marker2->Compute_Adtdt(m2_Rel_A_dtdt);

    ChVector<> vtemp1;
    ChVector<> vtemp2;

    vtemp1 = Body2->GetA_dt().transpose() * PQw;
    vtemp2 = m2_Rel_A_dt.transpose() * vtemp1;
    q_4 = Vmul(vtemp2, 2);  // 2[Aq_dt]'[Ao2_dt]'*Qpq,w

    vtemp1 = Body2->GetA().transpose() * PQw_dt;
    vtemp2 = m2_Rel_A_dt.transpose() * vtemp1;
    vtemp2 = Vmul(vtemp2, 2);  // 2[Aq_dt]'[Ao2]'*Qpq,w_dt
    q_4 = Vadd(q_4, vtemp2);

    vtemp1 = Body2->GetA_dt().transpose() * PQw_dt;
    vtemp2 = marker2->GetA().transpose() * vtemp1;
    vtemp2 = Vmul(vtemp2, 2);  // 2[Aq]'[Ao2_dt]'*Qpq,w_dt
    q_4 = Vadd(q_4, vtemp2);

    vtemp1 = Body2->GetA().transpose() * PQw;
    vtemp2 = m2_Rel_A_dtdt.transpose() * vtemp1;
    q_4 = Vadd(q_4, vtemp2);  //  [Aq_dtdt]'[Ao2]'*Qpq,w

    // ----------- RELATIVE MARKER COORDINATES

    // relM.pos
    relM.pos = marker2->GetA().transpose() * (Body2->GetA().transpose() * PQw);

    // relM.rot
    relM.rot = Qcross(Qconjugate(marker2->GetCoord().rot),
                      Qcross(Qconjugate(marker2->GetBody()->GetCoord().rot),
                             Qcross((marker1->GetBody()->GetCoord().rot), (marker1->GetCoord().rot))));

    // relM_dt.pos
    relM_dt.pos = m2_Rel_A_dt.transpose() * (Body2->GetA().transpose() * PQw) +
                  marker2->GetA().transpose() * (Body2->GetA_dt().transpose() * PQw) +
                  marker2->GetA().transpose() * (Body2->GetA().transpose() * PQw_dt);

    // relM_dt.rot
    relM_dt.rot = Qadd(q_AD, q_BC);

    // relM_dtdt.pos
    relM_dtdt.pos = marker2->GetA().transpose() * (Body2->GetA_dtdt().transpose() * PQw) +
                    marker2->GetA().transpose() * (Body2->GetA().transpose() * PQw_dtdt) + q_4;

    // relM_dtdt.rot
    qtemp1 = Qcross(Qconjugate(marker2->GetCoord().rot),
                    Qcross(Qconjugate(Body2->GetCoord_dtdt().rot),
                           Qcross(Body1->GetCoord().rot,
                                  marker1->GetCoord().rot)));  // ( q'm2 * q_dtdt'o2 * q,o1 * q,m1)
    relM_dtdt.rot = Qadd(q_8, qtemp1);
    qtemp1 = Qcross(Qconjugate(marker2->GetCoord().rot),
                    Qcross(Qconjugate(Body2->GetCoord().rot),
                           Qcross(Body1->GetCoord_dtdt().rot,
                                  marker1->GetCoord().rot)));  // ( q'm2 * q'o2 * q_dtdt,o1 * q,m1)
    relM_dtdt.rot = Qadd(relM_dtdt.rot, qtemp1);               // = q_8 + qq''qq + qqq''q

    // ... and also "user-friendly" relative coordinates:

    // relAngle and relAxis
    Q_to_AngAxis(relM.rot, relAngle, relAxis);
    // flip rel rotation axis if jerky sign
    if (relAxis.z() < 0) {
        relAxis = Vmul(relAxis, -1);
        relAngle = -relAngle;
    }
    // rotation axis
    relRotaxis = Vmul(relAxis, relAngle);
    // relWvel
    ChGwMatrix34<> relGw(relM.rot);
    relWvel = relGw * relM_dt.rot;
    // relWacc
    relWacc = relGw * relM_dtdt.rot;
}